

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkCleanNext_rec(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  lVar3 = (long)pNtk->vObjs->nSize;
  if (0 < lVar3) {
    ppvVar1 = pNtk->vObjs->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar1[lVar5];
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + 8) = 0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  pVVar4 = pNtk->vBoxes;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if ((*(uint *)((long)pVVar4->pArray[lVar3] + 0x14) & 0xf) != 9) {
        __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x150,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
      }
      Abc_NtkCleanNext_rec(*(Abc_Ntk_t **)((long)pVVar4->pArray[lVar3] + 0x38));
      lVar3 = lVar3 + 1;
      pVVar4 = pNtk->vBoxes;
    } while (lVar3 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Abc_NtkCleanNext_rec( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; 
    int i;
    Abc_NtkCleanNext( pNtk );
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkCleanNext_rec( Abc_ObjModel(pObj) );
}